

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O1

void tellUserTags(vector<int,_std::allocator<int>_> *tags)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"There are these tags: ",0x16);
  piVar2 = (tags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar3 = (tags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar2; piVar3 = piVar3 + 1) {
    iVar1 = *piVar3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::ostream::operator<<((ostream *)&std::cout,iVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void tellUserTags(const std::vector<int>& tags){
    std::cout << "There are these tags: ";
    for(auto t : tags) std::cout << " " << t;
    std::cout << std::endl;
}